

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QPixmapIconEngineEntry>::copyAppend
          (QGenericArrayOps<QPixmapIconEngineEntry> *this,QPixmapIconEngineEntry *b,
          QPixmapIconEngineEntry *e)

{
  qsizetype *pqVar1;
  QPixmapIconEngineEntry *pQVar2;
  long lVar3;
  Data *pDVar4;
  Mode MVar5;
  State SVar6;
  QPixmapIconEngineEntry *this_00;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QPixmapIconEngineEntry>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QPixmapIconEngineEntry>).size;
      this_00 = pQVar2 + lVar3;
      QPixmap::QPixmap(&this_00->pixmap,&b->pixmap);
      pDVar4 = (b->fileName).d.d;
      pQVar2[lVar3].fileName.d.d = pDVar4;
      pQVar2[lVar3].fileName.d.ptr = (b->fileName).d.ptr;
      pQVar2[lVar3].fileName.d.size = (b->fileName).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      MVar5 = b->mode;
      SVar6 = b->state;
      this_00->size = b->size;
      this_00->mode = MVar5;
      this_00->state = SVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QPixmapIconEngineEntry>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }